

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

size_t __thiscall
Memory::LargeHeapBlock::RescanMultiPage(LargeHeapBlock *this,Recycler *recycler,RescanFlags flags)

{
  MarkContext *this_00;
  size_t *psVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  LargeHeapBlock *this_01;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  size_t *psVar11;
  char *pcVar12;
  size_t *psVar14;
  byte bVar15;
  char *this_02;
  uint index;
  undefined8 *in_FS_OFFSET;
  size_t local_68;
  char *local_60;
  size_t *psVar13;
  
  if (this->pageCount == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x56c,"(this->GetPageCount() != 1)","this->GetPageCount() != 1");
    if (!bVar4) {
LAB_00247799:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  bVar4 = (this->super_HeapBlock).needOOMRescan;
  (this->super_HeapBlock).needOOMRescan = false;
  index = 0;
  if (this->allocCount == 0) {
    local_68 = 0;
  }
  else {
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    this_00 = &recycler->markContext;
    local_68 = 0;
    local_60 = (char *)0x0;
    bVar7 = false;
    do {
      this_01 = (LargeHeapBlock *)GetHeaderByIndex(this,index);
      if (this_01 != (LargeHeapBlock *)0x0) {
        psVar13 = &this_01->pageCount;
        bVar5 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,psVar13);
        if (bVar5) {
          this_02 = (char *)this_01;
          bVar6 = LargeObjectHeader::GetAttributes((LargeObjectHeader *)this_01,recycler->Cookie);
          uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),-1 < (char)bVar6);
          if ((bVar6 & 4) != 0 && -1 >= (char)bVar6) {
            psVar11 = &(recycler->collectionStats).finalizeCount;
            *psVar11 = *psVar11 + 1;
            uVar10 = *(uint *)&(this_01->super_HeapBlock).segment ^ recycler->Cookie;
            uVar10 = uVar10 >> 0x18 ^ uVar10 ^ uVar10 >> 0x10 ^ uVar10 >> 8;
            bVar15 = (byte)uVar10 ^ bVar6 & 0xfb;
            this_02 = (char *)(ulong)CONCAT31((int3)(uVar10 >> 8),bVar15);
            uVar10 = (uint)(CONCAT11(bVar6,bVar15) & 0xfbff) ^ recycler->Cookie;
            uVar8 = (ulong)uVar10;
            uVar9 = (ushort)uVar10;
            (this_01->super_HeapBlock).heapBlockType = (char)uVar9;
            (this_01->super_HeapBlock).needOOMRescan = (bool)(char)(uVar9 >> 8);
          }
          if ((bVar6 & 0x20) == 0) {
            pcVar12 = (this_01->super_HeapBlock).address;
            if ((this->pageHeapData != (PageHeapData *)0x0) &&
               (this->pageHeapData->pageHeapMode != PageHeapModeOff)) {
              pcVar12 = (char *)((ulong)pcVar12 & 0xfffffffffffffff8);
            }
            if (pcVar12 == (char *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar2 = 1;
              this_02 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
              ;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x5af,"(objectSize > 0)","objectSize > 0");
              if (!bVar5) goto LAB_00247799;
              *puVar2 = 0;
              uVar8 = extraout_RDX_00;
            }
            if ((bVar4 == false) &&
               (((this_01->super_HeapBlock).isPendingConcurrentSweep & 1U) != 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar2 = 1;
              this_02 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
              ;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x5b0,"(oldNeedOOMRescan || !header->markOnOOMRescan)",
                                 "oldNeedOOMRescan || !header->markOnOOMRescan");
              if (!bVar5) goto LAB_00247799;
              *puVar2 = 0;
              uVar8 = extraout_RDX_01;
            }
            if (((this_01->super_HeapBlock).isPendingConcurrentSweep & 1U) == 0) {
              if (recycler->inEndMarkOnLowMemory == false) {
                psVar11 = (size_t *)(pcVar12 + (long)psVar13);
                bVar15 = 0;
                do {
                  pcVar12 = (char *)((ulong)psVar13 & 0xfffffffffffff000);
                  if (local_60 == pcVar12) {
                    if (!bVar7) goto LAB_00247710;
LAB_002475f9:
                    psVar14 = (size_t *)(pcVar12 + 0x1000);
                    if (psVar11 <= pcVar12 + 0x1000) {
                      psVar14 = psVar11;
                    }
                    if ((bVar6 & 0x10) != 0) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar2 = 1;
                      bVar7 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                         ,0x641,"(!(attributes & TrackBit))",
                                         "!(attributes & TrackBit)");
                      if (!bVar7) goto LAB_00247799;
                      *puVar2 = 0;
                    }
                    if ((recycler->collectionState).value == CollectionStateParallelMark) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar2 = 1;
                      bVar7 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                         ,0x206,
                                         "(this->collectionState != CollectionStateParallelMark)",
                                         "this->collectionState != CollectionStateParallelMark");
                      if (!bVar7) goto LAB_00247799;
                      *puVar2 = 0;
                    }
                    this_02 = (char *)this_00;
                    bVar7 = MarkContext::AddMarkedObject
                                      (this_00,psVar13,(long)psVar14 - (long)psVar13);
                    uVar8 = extraout_RDX_03;
                    if (!bVar7) {
                      this_02 = (char *)this;
                      HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
                      bVar7 = (this_01->super_HeapBlock).isPendingConcurrentSweep;
                      uVar8 = extraout_RDX_04;
                      if ((bVar7 & 4U) == 0) {
                        (this_01->super_HeapBlock).isPendingConcurrentSweep = (bool)(bVar7 | 1);
                      }
                    }
                    psVar1 = &(recycler->collectionStats).markData.rescanLargePageCount;
                    *psVar1 = *psVar1 + 1;
                    psVar1 = &(recycler->collectionStats).markData.rescanLargeByteCount;
                    *psVar1 = *psVar1 + ((long)psVar14 - (long)psVar13);
                    local_68 = local_68 + 1;
                    bVar7 = true;
                    bVar15 = 1;
                  }
                  else {
                    bVar7 = IsPageDirty((LargeHeapBlock *)this_02,pcVar12,(RescanFlags)uVar8,
                                        (bool)(((this_01->super_HeapBlock).isPendingConcurrentSweep
                                               & 2U) >> 1));
                    uVar8 = extraout_RDX_02;
                    local_60 = pcVar12;
                    if (bVar7) goto LAB_002475f9;
LAB_00247710:
                    psVar14 = (size_t *)(pcVar12 + 0x1000);
                    bVar7 = false;
                  }
                  psVar13 = psVar14;
                } while (psVar14 < psVar11);
                uVar8 = (ulong)bVar15;
              }
              else {
                uVar8 = 0;
              }
            }
            else {
              if ((bVar6 & 0x10) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar2 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                   ,0x5c3,"(!(attributes & TrackBit))","!(attributes & TrackBit)");
                if (!bVar5) goto LAB_00247799;
                *puVar2 = 0;
              }
              if ((recycler->collectionState).value == CollectionStateParallelMark) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar2 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                   ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                                   "this->collectionState != CollectionStateParallelMark");
                if (!bVar5) goto LAB_00247799;
                *puVar2 = 0;
              }
              bVar5 = MarkContext::AddMarkedObject(this_00,psVar13,(size_t)pcVar12);
              if (!bVar5) {
                HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
                bVar5 = (this_01->super_HeapBlock).isPendingConcurrentSweep;
                if ((bVar5 & 4U) == 0) {
                  (this_01->super_HeapBlock).isPendingConcurrentSweep = (bool)(bVar5 | 1);
                }
                if (recycler->inEndMarkOnLowMemory != false) {
                  return local_68;
                }
                goto LAB_0024776f;
              }
              bVar5 = (this_01->super_HeapBlock).isPendingConcurrentSweep;
              uVar8 = 1;
              if ((bVar5 & 4U) == 0) {
                (this_01->super_HeapBlock).isPendingConcurrentSweep = (bool)(bVar5 & 0xfa);
              }
            }
            psVar13 = &(recycler->collectionStats).markData.rescanLargeObjectCount;
            *psVar13 = *psVar13 + uVar8;
          }
        }
      }
LAB_0024776f:
      index = index + 1;
    } while (index < this->allocCount);
  }
  return local_68;
}

Assistant:

size_t
LargeHeapBlock::RescanMultiPage(Recycler * recycler)
#endif
{
    Assert(this->GetPageCount() != 1);
    DebugOnly(bool oldNeedOOMRescan = this->needOOMRescan);

    // Reset this, we'll increment this if we OOM again
    this->needOOMRescan = false;

    size_t rescanCount = 0;
    uint objectIndex = 0;
#if ENABLE_CONCURRENT_GC
    char * lastPageCheckedForWriteWatch = nullptr;
    bool isLastPageCheckedForWriteWatchDirty = false;
#endif

    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;

    while (objectIndex < allocCount)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
        objectIndex++;

        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't rescan
        if (!heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(recycler->Cookie);

#ifdef RECYCLER_STATS
        if (((attributes & FinalizeBit) != 0) && ((attributes & NewFinalizeBit) != 0))
        {
            // The concurrent thread saw a false reference to this object and marked it before the attribute was set.
            // As such, our finalizeCount is not correct.  Update it now.

            RECYCLER_STATS_INC(recycler, finalizeCount);
            header->SetAttributes(recycler->Cookie, (attributes & ~NewFinalizeBit));
        }
#endif

        // check whether the object is a leaf and doesn't need to be scanned
        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

#ifdef RECYCLER_STATS
        bool objectScanned = false;
#endif

        size_t objectSize = header->objectSize;
#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
        }
#endif

        Assert(objectSize > 0);
        Assert(oldNeedOOMRescan || !header->markOnOOMRescan);
        // Avoid writing to the page unnecessary by checking first
        if (header->markOnOOMRescan)
        {
            bool noOOMDuringMark = true;
#ifdef RECYCLER_VISITED_HOST
            if (attributes & TrackBit)
            {
                noOOMDuringMark = recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddress));
                if (noOOMDuringMark)
                {
                    // Object has been successfully processed, so clear NewTrackBit
                    header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                    RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                }
            }
            else
#endif
            {
                Assert(!(attributes & TrackBit));
                noOOMDuringMark = recycler->AddMark(objectAddress, objectSize);
            }

            if (!noOOMDuringMark)
            {
                this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                if (!header->isObjectPageLocked)
#endif
                {
                    header->markOnOOMRescan = true;
                }

                // We need to bail out of rescan early only if the recycler is
                // trying to finish marking because of low memory. If this is
                // a regular rescan, we want to try and rescan all the objects
                // on the page. It's possible that the rescan OOMs but if the
                // object rescan does OOM, we'll set the right bit on the
                // object header. When we later rescan it in a low memory
                // situation, when the bit is set, we don't need to check for
                // write-watch etc. since we'd have already done that before
                // setting the bit in the non-low-memory rescan case.
                if (!recycler->inEndMarkOnLowMemory)
                {
                    continue;
                }

                return rescanCount;
            }
#ifdef RECYCLER_PAGE_HEAP
            if (!header->isObjectPageLocked)
#endif
            {
                header->markOnOOMRescan = false;
            }
#ifdef RECYCLER_STATS
            objectScanned = true;
#endif
        }
#if ENABLE_CONCURRENT_GC
        else if (!recycler->inEndMarkOnLowMemory)
        {
            char * objectAddressEnd = objectAddress + objectSize;
            // Walk through the object, checking if any of its pages have been written to
            // If it has, then queue up this object for marking
#ifdef RECYCLER_VISITED_HOST
            bool tracedObject = attributes & TrackBit;
            char * objectAddressStart = objectAddress;
#endif
            do
            {
                char * pageStart = (char *)(((size_t)objectAddress) & ~(size_t)(AutoSystemInfo::PageSize - 1));

                /*
                * The rescan logic for large conservatively scanned object is as follows:
                *  - We rescan the object if it was marked during concurrent mark
                *  - If it was marked, since the large object has multiple pages, we'll rescan only the parts that were changed
                *  - So for each page in the large object, check if it's been written to, and if it hasn't, skip looking at that region
                *  - If we can't get the write watch, rescan that region
                *  - However, this logic applies only if we're not rescanning because of an OOM
                *  - If we are rescanning this object because of OOM (i.e !rescanBecauseOfOOM = false), rescan the whole object
                * For large traced objects we rescan the object and if one of its pages has changed we will rescan the entire object
                *
                * We cache the result of the write watch and the page that it was checked on so that we don't call GetWriteWatch on the same
                * page twice and inadvertently reset the write watch on a page where we've already scanned an object
                */
                if (lastPageCheckedForWriteWatch != pageStart)
                {
                    lastPageCheckedForWriteWatch = pageStart;
                    isLastPageCheckedForWriteWatchDirty = true;
                    bool hasWriteBarrier = false;
#ifdef RECYCLER_WRITE_BARRIER
                    hasWriteBarrier = header->hasWriteBarrier;
#endif
                    if (!IsPageDirty(pageStart, flags, hasWriteBarrier))
                    {
                        // Fall through to the case below where we'll update objectAddress and continue
                        isLastPageCheckedForWriteWatchDirty = false;
                    }
                }

                if (!isLastPageCheckedForWriteWatchDirty)
                {
                    objectAddress = pageStart + AutoSystemInfo::PageSize;
                    continue;
                }

                // We're interested in only rescanning the parts of the object that have changed, not the whole
                // object. So just queue that up for marking
                char * checkEnd = min(pageStart + AutoSystemInfo::PageSize, objectAddressEnd);

#ifdef RECYCLER_VISITED_HOST
                if (tracedObject)
                {
                    // The object has one dirty page so we need to trace it
                    if (!recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddressStart)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }
                    else
                    {
                        // Object has been successfully processed, so clear NewTrackBit
                        header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                        RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                    }

                    rescanCount = objectSize / AutoSystemInfo::PageSize +
                        (objectSize % AutoSystemInfo::PageSize != 0 ? 1 : 0);
#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount += rescanCount;
                    recycler->collectionStats.markData.rescanLargeByteCount += objectSize;
#endif
                    // We don't need to continue as we are tracing the whole object
                    break;
                }
                else
#endif
                {
                    Assert(!(attributes & TrackBit));
                    if (!recycler->AddMark(objectAddress, (checkEnd - objectAddress)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }

#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount++;
                    recycler->collectionStats.markData.rescanLargeByteCount += (checkEnd - objectAddress);
#endif
                }

                objectAddress = checkEnd;
                rescanCount++;
            }
            while (objectAddress < objectAddressEnd);
        }
#else
        else
        {
            Assert(recycler->inEndMarkOnLowMemory);
        }
#endif
        RECYCLER_STATS_ADD(recycler, markData.rescanLargeObjectCount, objectScanned);
    }

    return rescanCount;
}